

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::format_array_nested_array(void)

{
  iterator iVar1;
  iterator iVar2;
  basic_variable<std::allocator<char>_> *data_00;
  type *local_218;
  basic_variable<std::allocator<char>_> *local_200;
  undefined8 uStack_1d8;
  value_type expected [17];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  type local_198;
  basic_variable<std::allocator<char>_> local_168;
  type local_138;
  nullable local_114;
  basic_variable<std::allocator<char>_> *local_110;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_110 = &local_108;
  local_114 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,&local_114);
  local_110 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_110,true);
  local_110 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&local_198.__align,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_168,3.0);
  local_138._0_8_ = &local_198;
  local_138._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &local_138.__align);
  local_110 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,"ABC");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_200 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_200 = local_200 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_200);
  } while (local_200 != &local_108);
  local_218 = &local_138;
  do {
    local_218 = (type *)((long)local_218 + -0x30);
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)&local_218->__align);
  } while (local_218 != &local_198);
  trial::protocol::bintoken::
  format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10),
             (bintoken *)local_38,data_00);
  uStack_1d8 = 0xc50292818292;
  expected[0] = '@';
  expected[1] = '@';
  expected[2] = 0x93;
  expected[3] = 0xa9;
  expected[4] = '\x03';
  expected[5] = 'A';
  expected[6] = 'B';
  expected[7] = 'C';
  expected[8] = 0x93;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10));
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x137,"void formatter_suite::format_array_nested_array()",iVar1._M_current,
             iVar2._M_current,&uStack_1d8,expected + 9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(expected + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void format_array_nested_array()
{
    variable data = { null, true, { 2, 3.0f }, "ABC" };
    auto result = bintoken::format<buffer_type>(data);
    const value_type expected[] = {
        bintoken::token::code::begin_array,
        bintoken::token::code::null,
        bintoken::token::code::true_value,
        bintoken::token::code::begin_array,
        0x02,
        bintoken::token::code::float32, 0x00, 0x00, 0x40, 0x40,
        bintoken::token::code::end_array,
        bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
        bintoken::token::code::end_array
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}